

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int authorize(mg_connection *conn,mg_file *filep,char *realm)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ushort **ppuVar5;
  pthread_t *ppVar6;
  mg_context *ctx;
  ulonglong uVar7;
  ulong uVar8;
  ulong uVar9;
  pthread_t **pppVar10;
  bool bVar11;
  undefined1 local_22f0 [40];
  pthread_t *local_22c8;
  undefined1 auStack_22c0 [24];
  pthread_t *local_22a8;
  pthread_t *ppStack_22a0;
  pthread_t *local_2298;
  pthread_t *ppStack_2290;
  pthread_t *local_2288;
  socket *local_2280 [73];
  char buf [8192];
  
  if (conn->dom_ctx == (mg_domain_context *)0x0) {
    return 0;
  }
  memset(local_2280,0,0x248);
  local_22c8 = (pthread_t *)0x0;
  auStack_22c0._0_8_ = 0;
  auStack_22c0._8_8_ = (char *)0x0;
  auStack_22c0._16_8_ = 0;
  local_22a8 = (pthread_t *)0x0;
  ppStack_22a0 = (pthread_t *)0x0;
  local_2298 = (pthread_t *)0x0;
  ppStack_2290 = (pthread_t *)0x0;
  local_2288 = (pthread_t *)0x0;
  local_22f0._32_8_ = conn;
  pcVar4 = mg_get_header(conn,"Authorization");
  if (pcVar4 == (char *)0x0) {
    return 0;
  }
  iVar3 = mg_strncasecmp(pcVar4,"Basic ",6);
  if (iVar3 == 0) {
    ctx = (mg_context *)strlen(pcVar4 + 6);
    local_22f0._24_8_ = 0x2000;
    iVar3 = mg_base64_decode(pcVar4 + 6,(size_t)ctx,(uchar *)buf,(size_t *)(local_22f0 + 0x18));
    if (iVar3 == -1) {
      ppVar6 = (pthread_t *)buf;
      ctx = (mg_context *)0x3a;
      pcVar4 = strchr((char *)ppVar6,0x3a);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
        auStack_22c0._0_4_ = 1;
        auStack_22c0._8_8_ = pcVar4 + 1;
        bVar11 = true;
        local_22c8 = ppVar6;
        goto LAB_0010eb1e;
      }
    }
    ppVar6 = (pthread_t *)0x0;
    bVar11 = false;
  }
  else {
    iVar3 = mg_strncasecmp(pcVar4,"Digest ",7);
    if (iVar3 != 0) {
      return 0;
    }
    auStack_22c0._0_4_ = 2;
    local_22f0._8_8_ = realm;
    local_22f0._16_8_ = filep;
    mg_strlcpy(buf,pcVar4 + 7,0x2000);
    ppuVar5 = __ctype_b_loc();
    local_22f0._0_8_ = buf;
    while( true ) {
      local_22f0._0_8_ = local_22f0._0_8_ + -1;
      do {
        pbVar1 = (byte *)(local_22f0._0_8_ + 1);
        uVar9 = (ulong)*pbVar1;
        local_22f0._0_8_ = local_22f0._0_8_ + 1;
      } while ((*(byte *)((long)*ppuVar5 + uVar9 * 2 + 1) & 0x20) != 0);
      pcVar4 = skip_quoted((char **)local_22f0,"=",(char *)0x0,*pbVar1);
      if (*(char *)local_22f0._0_8_ == '\"') {
        local_22f0._0_8_ = local_22f0._0_8_ + 1;
        ppVar6 = (pthread_t *)skip_quoted((char **)local_22f0,"\"",(char *)0x5c,(char)uVar9);
        if (*(char *)local_22f0._0_8_ == ',') {
          local_22f0._0_8_ = local_22f0._0_8_ + 1;
        }
      }
      else {
        ppVar6 = (pthread_t *)skip_quoted((char **)local_22f0,", ",(char *)0x0,(char)uVar9);
      }
      filep = (mg_file *)local_22f0._16_8_;
      realm = (char *)local_22f0._8_8_;
      cVar2 = *pcVar4;
      if (cVar2 == '\0') break;
      iVar3 = strcmp(pcVar4,"username");
      pppVar10 = &local_22c8;
      if (iVar3 == 0) goto LAB_0010ea13;
      iVar3 = strcmp(pcVar4,"cnonce");
      pppVar10 = (pthread_t **)(auStack_22c0 + 0x18);
      if (iVar3 == 0) goto LAB_0010ea13;
      iVar3 = strcmp(pcVar4,"response");
      pppVar10 = (pthread_t **)(auStack_22c0 + 0x20);
      if (iVar3 == 0) goto LAB_0010ea13;
      iVar3 = strcmp(pcVar4,"uri");
      pppVar10 = (pthread_t **)(auStack_22c0 + 0x10);
      if (iVar3 == 0) goto LAB_0010ea13;
      iVar3 = strcmp(pcVar4,"qop");
      pppVar10 = &local_2298;
      if ((iVar3 == 0) ||
         (((cVar2 == 'n' && (pcVar4[1] == 'c')) && (pppVar10 = &ppStack_2290, pcVar4[2] == '\0'))))
      goto LAB_0010ea13;
      iVar3 = strcmp(pcVar4,"nonce");
      pppVar10 = &local_2288;
      if (iVar3 == 0) {
LAB_0010ea13:
        *pppVar10 = ppVar6;
      }
    }
    if (local_2288 == (pthread_t *)0x0) {
      return 0;
    }
    ctx = (mg_context *)local_22f0;
    local_22f0._0_8_ = (char *)0x0;
    uVar7 = strtoull((char *)local_2288,(char **)ctx,10);
    if ((char *)local_22f0._0_8_ == (char *)0x0) {
      return 0;
    }
    if (*(char *)local_22f0._0_8_ != '\0') {
      return 0;
    }
    uVar8 = uVar7 ^ conn->dom_ctx->auth_nonce_mask;
    uVar9 = conn->phys_ctx->start_time;
    if (uVar8 < uVar9) {
      return 0;
    }
    if (uVar9 + conn->dom_ctx->nonce_count <= uVar8) {
      return 0;
    }
    bVar11 = local_22c8 != (pthread_t *)0x0;
    ppVar6 = local_22c8;
  }
LAB_0010eb1e:
  if (!bVar11) {
    return 0;
  }
  pcVar4 = mg_strdup_ctx((char *)ppVar6,ctx);
  (conn->request_info).remote_user = pcVar4;
  if ((socket *)realm == (socket *)0x0) {
    realm = conn->dom_ctx->config[0x1e];
  }
  local_2280[0] = (socket *)realm;
  iVar3 = read_auth_file(filep,(read_auth_file_struct *)(local_22f0 + 0x20),9);
  return iVar3;
}

Assistant:

static int
authorize(struct mg_connection *conn, struct mg_file *filep, const char *realm)
{
	struct read_auth_file_struct workdata;
	char buf[MG_BUF_LEN];

	if (!conn || !conn->dom_ctx) {
		return 0;
	}

	memset(&workdata, 0, sizeof(workdata));
	workdata.conn = conn;

	if (!parse_auth_header(conn, buf, sizeof(buf), &workdata.ah)) {
		return 0;
	}

	/* CGI needs it as REMOTE_USER */
	conn->request_info.remote_user =
	    mg_strdup_ctx(workdata.ah.user, conn->phys_ctx);

	if (realm) {
		workdata.domain = realm;
	} else {
		workdata.domain = conn->dom_ctx->config[AUTHENTICATION_DOMAIN];
	}

	return read_auth_file(filep, &workdata, INITIAL_DEPTH);
}